

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int nni_ws_listener_alloc(nng_stream_listener **wslp,nng_url *url)

{
  nng_stream_listener *data;
  size_t sVar1;
  char *local_38;
  char *host;
  int rv;
  nni_ws_listener *l;
  nng_url *url_local;
  nng_stream_listener **wslp_local;
  
  data = (nng_stream_listener *)nni_zalloc(0x160);
  if (data == (nng_stream_listener *)0x0) {
    wslp_local._4_4_ = NNG_ENOMEM;
  }
  else {
    nni_mtx_init((nni_mtx *)&data[1].sl_stop);
    nni_cv_init((nni_cv *)&data[1].sl_get_tls,(nni_mtx *)&data[1].sl_stop);
    nni_aio_list_init((nni_list *)(data + 3));
    nni_list_init_offset((nni_list *)&data[2].sl_accept,0x38);
    nni_list_init_offset((nni_list *)&data[2].sl_get_tls,0x38);
    nni_list_init_offset((nni_list *)&data[3].sl_set_tls,0);
    wslp_local._4_4_ = nng_url_clone((nng_url **)&data[3].sl_listen,url);
    if (wslp_local._4_4_ == NNG_OK) {
      local_38 = *(char **)(data[3].sl_listen + 0x10);
      sVar1 = strlen(local_38);
      if (sVar1 == 0) {
        local_38 = (char *)0x0;
      }
      wslp_local._4_4_ =
           nni_http_handler_init((nni_http_handler **)&data[3].sl_get,url->u_path,ws_handler);
      if (wslp_local._4_4_ == NNG_OK) {
        nni_http_handler_set_host((nni_http_handler *)data[3].sl_get,local_38);
        nni_http_handler_set_data((nni_http_handler *)data[3].sl_get,data,(nni_cb)0x0);
        wslp_local._4_4_ = nni_http_server_init((nni_http_server **)(data + 1),url);
        if (wslp_local._4_4_ == NNG_OK) {
          data[4].sl_stop = (_func_void_void_ptr *)0x10000;
          data[4].sl_close = (_func_void_void_ptr *)&Elf64_Ehdr_00100000;
          data[4].sl_listen = (_func_int_void_ptr *)&Elf64_Ehdr_00100000;
          *(undefined1 *)((long)&data[3].sl_accept + 2) = 1;
          data->sl_free = ws_listener_free;
          data->sl_close = ws_listener_close;
          data->sl_stop = ws_listener_stop;
          data->sl_accept = ws_listener_accept;
          data->sl_listen = ws_listener_listen;
          data->sl_set = ws_listener_set;
          data->sl_get = ws_listener_get;
          data->sl_get_tls = ws_listener_get_tls;
          data->sl_set_tls = ws_listener_set_tls;
          *wslp = data;
          wslp_local._4_4_ = NNG_OK;
        }
        else {
          ws_listener_free(data);
        }
      }
      else {
        ws_listener_free(data);
      }
    }
    else {
      ws_listener_free(data);
    }
  }
  return wslp_local._4_4_;
}

Assistant:

int
nni_ws_listener_alloc(nng_stream_listener **wslp, const nng_url *url)
{
	nni_ws_listener *l;
	int              rv;
	char            *host;

	if ((l = NNI_ALLOC_STRUCT(l)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&l->mtx);
	nni_cv_init(&l->cv, &l->mtx);
	nni_aio_list_init(&l->aios);

	NNI_LIST_INIT(&l->pend, nni_ws, node);
	NNI_LIST_INIT(&l->reply, nni_ws, node);
	NNI_LIST_INIT(&l->headers, ws_header, node);

	// make a private copy of the url structure.
	if ((rv = nng_url_clone(&l->url, url)) != 0) {
		ws_listener_free(l);
		return (rv);
	}

	host = l->url->u_hostname;
	if (strlen(host) == 0) {
		host = NULL;
	}
	rv = nni_http_handler_init(&l->handler, url->u_path, ws_handler);
	if (rv != 0) {
		ws_listener_free(l);
		return (rv);
	}

	nni_http_handler_set_host(l->handler, host);
	nni_http_handler_set_data(l->handler, l, 0);

	if ((rv = nni_http_server_init(&l->server, url)) != 0) {
		ws_listener_free(l);
		return (rv);
	}

	l->fragsize       = WS_DEF_MAXTXFRAME;
	l->maxframe       = WS_DEF_MAXRXFRAME;
	l->recvmax        = WS_DEF_RECVMAX;
	l->isstream       = true;
	l->ops.sl_free    = ws_listener_free;
	l->ops.sl_close   = ws_listener_close;
	l->ops.sl_stop    = ws_listener_stop;
	l->ops.sl_accept  = ws_listener_accept;
	l->ops.sl_listen  = ws_listener_listen;
	l->ops.sl_set     = ws_listener_set;
	l->ops.sl_get     = ws_listener_get;
	l->ops.sl_get_tls = ws_listener_get_tls;
	l->ops.sl_set_tls = ws_listener_set_tls;
	*wslp             = (void *) l;
	return (0);
}